

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::LessThanEqualTest<char,unsigned_short>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_25;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_23;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  int local_20 [4];
  
  local_20[3] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_23,local_20 + 3);
  if ('\x01' < local_23.m_int) {
    local_20[2] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_24,local_20 + 2);
    if (local_24.m_int < '\x06') {
      local_20[1] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_25,local_20 + 1);
      local_20[0] = 7;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_22,local_20);
      return (int)local_25.m_int <= (int)(uint)local_22.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanEqualTest()
	{
		return
			(U)2 <= SafeInt<T>(3) &&
			SafeInt<T>(4) <= (U)5 &&
			SafeInt<T>(6) <= SafeInt<U>(7);
	}